

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextedit.cpp
# Opt level: O3

bool __thiscall QTextEditControl::canInsertFromMimeData(QTextEditControl *this,QMimeData *source)

{
  undefined1 uVar1;
  bool bVar2;
  long *plVar3;
  undefined1 auVar4 [16];
  
  auVar4 = QMetaObject::cast((QObject *)&QTextEdit::staticMetaObject);
  plVar3 = auVar4._0_8_;
  if (plVar3 != (long *)0x0) {
    uVar1 = (**(code **)(*plVar3 + 0x1d8))(plVar3,source,auVar4._8_8_,*(code **)(*plVar3 + 0x1d8));
    return (bool)uVar1;
  }
  bVar2 = QWidgetTextControl::canInsertFromMimeData((QWidgetTextControl *)this,source);
  return bVar2;
}

Assistant:

virtual bool canInsertFromMimeData(const QMimeData *source) const override {
        QTextEdit *ed = qobject_cast<QTextEdit *>(parent());
        if (!ed)
            return QWidgetTextControl::canInsertFromMimeData(source);
        return ed->canInsertFromMimeData(source);
    }